

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuf.c
# Opt level: O0

void raviX_buffer_add_fstring(TextBuffer *mb,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  int local_44;
  int local_40;
  int n;
  int i;
  int estimated_size;
  va_list args;
  char *fmt_local;
  TextBuffer *mb_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  n = 0x80;
  local_40 = 0;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  while( true ) {
    if (1 < local_40) {
      return;
    }
    raviX_buffer_reserve(mb,(long)n);
    args[0].overflow_arg_area = local_f8;
    args[0]._0_8_ = &stack0x00000008;
    estimated_size = 0x30;
    i = 0x10;
    local_44 = vsnprintf(mb->buf + mb->pos,(long)n,fmt,&i);
    if (local_44 < n) break;
    n = local_44 + 1;
    local_40 = local_40 + 1;
  }
  if (-1 < local_44) {
    mb->pos = (long)local_44 + mb->pos;
    return;
  }
  fprintf(_stderr,"Buffer conversion error\n");
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/membuf.c"
                ,0x67,"void raviX_buffer_add_fstring(TextBuffer *, const char *, ...)");
}

Assistant:

void raviX_buffer_add_fstring(TextBuffer *mb, const char *fmt, ...)
{
	va_list args;
	int estimated_size = 128;

	for (int i = 0; i < 2; i++) {
		raviX_buffer_reserve(mb, estimated_size); // ensure we have at least estimated_size free space
		va_start(args, fmt);
		int n = vsnprintf(mb->buf + mb->pos, estimated_size, fmt, args);
		va_end(args);
		if (n >= estimated_size) {
			estimated_size = n + 1; // allow for 0 byte
		} else if (n < 0) {
			fprintf(stderr, "Buffer conversion error\n");
			assert(false);
			break;
		} else {
			mb->pos += n;
			break;
		}
	}
}